

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<2,_11,_13>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  bool bVar1;
  float *pfVar2;
  bool bVar3;
  undefined4 *puVar4;
  long lVar5;
  long lVar6;
  float *pfVar7;
  int col;
  long lVar8;
  int col_1;
  float fVar9;
  undefined4 uVar10;
  Type in1;
  float afStack_d0 [2];
  undefined8 local_c8;
  float local_c0;
  Matrix<float,_2,_4> local_b8;
  int aiStack_90 [6];
  Matrix<float,_4,_4> local_78;
  float local_38;
  undefined8 uStack_34;
  float fStack_2c;
  float local_28;
  float local_24;
  undefined8 local_20;
  
  pfVar2 = local_b8.m_data.m_data[0].m_data + 1;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar5 = 0;
    pfVar7 = (float *)&local_b8;
    bVar1 = true;
    do {
      bVar3 = bVar1;
      lVar8 = 0;
      do {
        fVar9 = 1.0;
        if (lVar5 != lVar8) {
          fVar9 = 0.0;
        }
        pfVar7[lVar8 * 2] = fVar9;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      lVar5 = 1;
      pfVar7 = pfVar2;
      bVar1 = false;
    } while (bVar3);
    local_b8.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
    local_b8.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    local_b8.m_data.m_data[2].m_data = *(float (*) [2])evalCtx->in[2].m_data;
    local_b8.m_data.m_data[3].m_data = *(float (*) [2])evalCtx->in[3].m_data;
  }
  else {
    local_b8.m_data.m_data[2].m_data[0] = 0.0;
    local_b8.m_data.m_data[2].m_data[1] = 0.0;
    local_b8.m_data.m_data[3].m_data[0] = 0.0;
    local_b8.m_data.m_data[3].m_data[1] = 0.0;
    local_b8.m_data.m_data[0].m_data[0] = 0.0;
    local_b8.m_data.m_data[0].m_data[1] = 0.0;
    local_b8.m_data.m_data[1].m_data[0] = 0.0;
    local_b8.m_data.m_data[1].m_data[1] = 0.0;
    lVar5 = 0;
    pfVar7 = (float *)&local_b8;
    bVar1 = true;
    do {
      bVar3 = bVar1;
      lVar8 = 0;
      do {
        pfVar7[lVar8 * 2] = *(float *)((long)&s_constInMat4x2 + lVar5 + lVar8 * 4);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      lVar5 = 0x10;
      pfVar7 = pfVar2;
      bVar1 = false;
    } while (bVar3);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    pfVar2 = (float *)&local_78;
    lVar5 = 0;
    lVar8 = 0;
    do {
      lVar6 = 0;
      do {
        uVar10 = 0x3f800000;
        if (lVar5 != lVar6) {
          uVar10 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar6) = uVar10;
        lVar6 = lVar6 + 0x10;
      } while (lVar6 != 0x40);
      lVar8 = lVar8 + 1;
      pfVar2 = pfVar2 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar8 != 4);
    local_78.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_78.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_78.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    local_78.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_78.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    local_78.m_data.m_data[2].m_data._8_8_ = *(undefined8 *)(evalCtx->in[2].m_data + 2);
    local_78.m_data.m_data[3].m_data._0_8_ = *(undefined8 *)evalCtx->in[3].m_data;
    local_78.m_data.m_data[3].m_data._8_8_ = *(undefined8 *)(evalCtx->in[3].m_data + 2);
  }
  else {
    pfVar2 = (float *)&local_78;
    local_78.m_data.m_data[3].m_data[0] = 0.0;
    local_78.m_data.m_data[3].m_data[1] = 0.0;
    local_78.m_data.m_data[3].m_data[2] = 0.0;
    local_78.m_data.m_data[3].m_data[3] = 0.0;
    local_78.m_data.m_data[2].m_data[0] = 0.0;
    local_78.m_data.m_data[2].m_data[1] = 0.0;
    local_78.m_data.m_data[2].m_data[2] = 0.0;
    local_78.m_data.m_data[2].m_data[3] = 0.0;
    local_78.m_data.m_data[1].m_data[0] = 0.0;
    local_78.m_data.m_data[1].m_data[1] = 0.0;
    local_78.m_data.m_data[1].m_data[2] = 0.0;
    local_78.m_data.m_data[1].m_data[3] = 0.0;
    local_78.m_data.m_data[0].m_data[0] = 0.0;
    local_78.m_data.m_data[0].m_data[1] = 0.0;
    local_78.m_data.m_data[0].m_data[2] = 0.0;
    local_78.m_data.m_data[0].m_data[3] = 0.0;
    puVar4 = &DAT_01bf46d0;
    lVar5 = 0;
    do {
      lVar8 = 0;
      do {
        pfVar2[lVar8] = (float)*(undefined4 *)((long)puVar4 + lVar8);
        lVar8 = lVar8 + 4;
      } while (lVar8 != 0x10);
      lVar5 = lVar5 + 1;
      pfVar2 = pfVar2 + 1;
      puVar4 = puVar4 + 4;
    } while (lVar5 != 4);
  }
  afStack_d0[0] = 2.546194e-38;
  afStack_d0[1] = 0.0;
  tcu::operator*(&local_b8,&local_78);
  local_c8 = CONCAT44((float)((ulong)local_20 >> 0x20) +
                      fStack_2c + (float)((ulong)uStack_34 >> 0x20),
                      (float)local_20 + local_38 + (float)uStack_34);
  local_c0 = local_28 + local_24;
  aiStack_90[2] = 0;
  aiStack_90[3] = 1;
  aiStack_90[4] = 2;
  lVar5 = 2;
  do {
    (evalCtx->color).m_data[aiStack_90[lVar5]] = afStack_d0[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}